

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O1

void __thiscall adios2::transport::FilePOSIX::SetParameters(FilePOSIX *this,Params *params)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"FailOnEOF","");
  helper::GetParameter<bool>(params,&local_40,&this->m_FailOnEOF);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FilePOSIX::SetParameters(const Params &params)
{
    // Parameters are set from config parameters if present
    // Otherwise, they are set from environment if present
    // Otherwise, they remain at their default value

    helper::GetParameter(params, "FailOnEOF", m_FailOnEOF);
}